

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_callk(lua_State *L,int nargs,int nresults,lua_KContext ctx,lua_KFunction k)

{
  int iVar1;
  CallInfo *pCVar2;
  StkId pTVar3;
  int *piVar4;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4e6,"void lua_callk(lua_State *, int, int, lua_KContext, lua_KFunction)");
  }
  pCVar2 = L->ci;
  if ((k != (lua_KFunction)0x0) && ((pCVar2->callstatus & 2) != 0)) {
    __assert_fail("(k == ((void*)0) || !((L->ci)->callstatus & (1<<1))) && \"cannot use continuations inside hooks\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4e8,"void lua_callk(lua_State *, int, int, lua_KContext, lua_KFunction)");
  }
  pTVar3 = L->top;
  if ((long)pTVar3 - (long)pCVar2->func >> 4 <= (long)(nargs + 1)) {
    __assert_fail("((nargs+1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4e9,"void lua_callk(lua_State *, int, int, lua_KContext, lua_KFunction)");
  }
  if (L->status == '\0') {
    if ((nresults != -1) && ((long)pCVar2->top - (long)pTVar3 >> 4 < (long)(nresults - nargs))) {
      __assert_fail("((nresults) == (-1) || (L->ci->top - L->top >= (nresults) - (nargs))) && \"results from function overflow current stack size\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x4eb,"void lua_callk(lua_State *, int, int, lua_KContext, lua_KFunction)");
    }
    if ((k == (lua_KFunction)0x0) || (L->nny != 0)) {
      luaD_callnoyield(L,pTVar3 + -(long)(nargs + 1),nresults);
    }
    else {
      (pCVar2->u).c.k = k;
      (L->ci->u).c.ctx = ctx;
      luaD_call(L,pTVar3 + -(long)(nargs + 1),nresults);
    }
    if (nresults == -1) {
      if (L->ci->top < L->top) {
        L->ci->top = L->top;
      }
    }
    piVar4 = *(int **)&L[-1].hookmask;
    *piVar4 = *piVar4 + -1;
    if (*piVar4 == 0) {
      return;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x4f5,"void lua_callk(lua_State *, int, int, lua_KContext, lua_KFunction)");
  }
  __assert_fail("(L->status == 0) && \"cannot do calls on non-normal thread\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x4ea,"void lua_callk(lua_State *, int, int, lua_KContext, lua_KFunction)");
}

Assistant:

LUA_API void lua_callk (lua_State *L, int nargs, int nresults,
                        lua_KContext ctx, lua_KFunction k) {
  StkId func;
  lua_lock(L);
  api_check(L, k == NULL || !isLua(L->ci),
    "cannot use continuations inside hooks");
  api_checknelems(L, nargs+1);
  api_check(L, L->status == LUA_OK, "cannot do calls on non-normal thread");
  checkresults(L, nargs, nresults);
  func = L->top - (nargs+1);
  if (k != NULL && L->nny == 0) {  /* need to prepare continuation? */
    L->ci->u.c.k = k;  /* save continuation */
    L->ci->u.c.ctx = ctx;  /* save context */
    luaD_call(L, func, nresults);  /* do the call */
  }
  else  /* no continuation or no yieldable */
    luaD_callnoyield(L, func, nresults);  /* just do the call */
  adjustresults(L, nresults);
  lua_unlock(L);
}